

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

string * __thiscall
cmTargetSelectLinker::Choose_abi_cxx11_(string *__return_storage_ptr__,cmTargetSelectLinker *this)

{
  size_t sVar1;
  cmTarget *pcVar2;
  _Base_ptr p_Var3;
  long lVar4;
  ostream *poVar5;
  _Rb_tree_node_base *p_Var6;
  cmake *this_00;
  stringstream e;
  string local_218;
  cmListFileBacktrace local_1f8;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  sVar1 = (this->Preferred)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (sVar1 != 1) {
    if (sVar1 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      return __return_storage_ptr__;
    }
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target ",7);
    pcVar2 = this->Target->Target;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(pcVar2->Name)._M_dataplus._M_p,
                        (pcVar2->Name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5," contains multiple languages with the highest linker preference",0x3f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," (",2);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->Preference);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"):\n",3);
    for (p_Var6 = (this->Preferred)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &(this->Preferred)._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,*(char **)(p_Var6 + 1),(long)p_Var6[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Set the LINKER_LANGUAGE property for this target.",0x31);
    this_00 = cmLocalGenerator::GetCMakeInstance(this->Target->LocalGenerator);
    std::__cxx11::stringbuf::str();
    cmGeneratorTarget::GetBacktrace(&local_1f8,this->Target);
    cmake::IssueMessage(this_00,FATAL_ERROR,&local_218,&local_1f8,false);
    cmListFileBacktrace::~cmListFileBacktrace(&local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  p_Var3 = (this->Preferred)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  lVar4 = *(long *)(p_Var3 + 1);
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,lVar4,(long)&(p_Var3[1]._M_parent)->_M_color + lVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string Choose()
    {
    if(this->Preferred.empty())
      {
      return "";
      }
    else if(this->Preferred.size() > 1)
      {
      std::stringstream e;
      e << "Target " << this->Target->GetName()
        << " contains multiple languages with the highest linker preference"
        << " (" << this->Preference << "):\n";
      for(std::set<std::string>::const_iterator
            li = this->Preferred.begin(); li != this->Preferred.end(); ++li)
        {
        e << "  " << *li << "\n";
        }
      e << "Set the LINKER_LANGUAGE property for this target.";
      cmake* cm = this->Target->GetLocalGenerator()->GetCMakeInstance();
      cm->IssueMessage(cmake::FATAL_ERROR, e.str(),
                       this->Target->GetBacktrace());
      }
    return *this->Preferred.begin();
    }